

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O2

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::ArrayTypeInfo::Deserialize(ArrayTypeInfo *this,Deserializer *deserializer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  uint size_p;
  ArrayTypeInfo *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar2;
  LogicalType child_type;
  shared_ptr<duckdb::ArrayTypeInfo,_true> result;
  LogicalType local_40;
  
  Deserializer::ReadProperty<duckdb::LogicalType>(&child_type,deserializer,200,"child_type");
  size_p = Deserializer::ReadPropertyWithDefault<unsigned_int>(deserializer,0xc9,"size");
  this_00 = (ArrayTypeInfo *)operator_new(0x58);
  LogicalType::LogicalType(&local_40,&child_type);
  ArrayTypeInfo(this_00,&local_40,size_p);
  ::std::__shared_ptr<duckdb::ArrayTypeInfo,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::ArrayTypeInfo,void>
            ((__shared_ptr<duckdb::ArrayTypeInfo,(__gnu_cxx::_Lock_policy)2> *)&result,this_00);
  LogicalType::~LogicalType(&local_40);
  _Var1 = result.internal.super___shared_ptr<duckdb::ArrayTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  result.internal.super___shared_ptr<duckdb::ArrayTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       result.internal.super___shared_ptr<duckdb::ArrayTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type = _Var1._M_pi;
  result.internal.super___shared_ptr<duckdb::ArrayTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &result.internal.super___shared_ptr<duckdb::ArrayTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  LogicalType::~LogicalType(&child_type);
  sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> ArrayTypeInfo::Deserialize(Deserializer &deserializer) {
	auto child_type = deserializer.ReadProperty<LogicalType>(200, "child_type");
	auto size = deserializer.ReadPropertyWithDefault<uint32_t>(201, "size");
	auto result = duckdb::shared_ptr<ArrayTypeInfo>(new ArrayTypeInfo(std::move(child_type), size));
	return std::move(result);
}